

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O1

Atom * __thiscall
OpenMD::MoleculeCreator::createAtom
          (MoleculeCreator *this,ForceField *ff,AtomStamp *stamp,LocalIndexManager *localIndexMan)

{
  size_type *psVar1;
  double dVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  int iVar6;
  AtomType *this_00;
  undefined8 *puVar7;
  AtomType *this_01;
  DirectionalAtom *this_02;
  _func_int **pp_Var8;
  string atomTypeOverrideName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string baseType;
  ostringstream ss;
  string local_228;
  FixedChargeAdapter local_208;
  long local_200;
  undefined1 local_1f8 [80];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  paVar4 = &local_1a8[0].field_2;
  pcVar3 = (stamp->Type).data_._M_dataplus._M_p;
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_1f8 + 0x50),pcVar3,pcVar3 + (stamp->Type).data_._M_string_length);
  this_00 = ForceField::getAtomType(ff,(string *)(local_1f8 + 0x50));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if (this_00 == (AtomType *)0x0) {
    pcVar3 = (stamp->Type).data_._M_dataplus._M_p;
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1f8 + 0x50),pcVar3,pcVar3 + (stamp->Type).data_._M_string_length);
    snprintf(painCave.errMsg,2000,"Can not find Matching Atom Type for[%s]",
             local_1a8[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    simError();
  }
  if (stamp->hasOverride_ != true) goto LAB_0016cdea;
  AtomType::getName_abi_cxx11_((string *)(local_1f8 + 0x30),this_00);
  dVar2 = stamp->orCharge_;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1f8 + 0x50));
  std::ostream::_M_insert<double>(dVar2);
  local_208.at_ = (AtomType *)local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_1f8._48_8_,
             (undefined1 *)(local_1f8._56_8_ + local_1f8._48_8_));
  std::__cxx11::string::append((char *)&local_208);
  std::__cxx11::stringbuf::str();
  pp_Var8 = (_func_int **)0xf;
  if (local_208.at_ != (AtomType *)local_1f8) {
    pp_Var8 = (_func_int **)local_1f8._0_8_;
  }
  if (pp_Var8 < (_func_int **)(local_1f8._24_8_ + local_200)) {
    pp_Var8 = (_func_int **)0xf;
    if ((undefined1 *)local_1f8._16_8_ != local_1f8 + 0x20) {
      pp_Var8 = (_func_int **)local_1f8._32_8_;
    }
    if (pp_Var8 < (_func_int **)(local_1f8._24_8_ + local_200)) goto LAB_0016cc6f;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)(local_1f8 + 0x10),0,(char *)0x0,(ulong)local_208.at_);
  }
  else {
LAB_0016cc6f:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_208,local_1f8._16_8_);
  }
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  psVar1 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_228.field_2._M_allocated_capacity = *psVar1;
    local_228.field_2._8_8_ = puVar7[3];
  }
  else {
    local_228.field_2._M_allocated_capacity = *psVar1;
    local_228._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_228._M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((undefined1 *)local_1f8._16_8_ != local_1f8 + 0x20) {
    operator_delete((void *)local_1f8._16_8_,local_1f8._32_8_ + 1);
  }
  if (local_208.at_ != (AtomType *)local_1f8) {
    operator_delete(local_208.at_,local_1f8._0_8_ + 1);
  }
  this_01 = ForceField::getAtomType(ff,&local_228);
  if (this_01 == (AtomType *)0x0) {
    this_01 = (AtomType *)operator_new(0xf8);
    AtomType::AtomType(this_01);
    (*this_01->_vptr_AtomType[2])(this_01,this_00);
    AtomType::setIdent(this_01,(int)(ff->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count);
    AtomType::setName(this_01,&local_228);
    ForceField::addAtomType(ff,&local_228,this_01);
    local_208.at_ = this_01;
    FixedChargeAdapter::makeFixedCharge
              (&local_208,dVar2 * (ff->forceFieldOptions_).ChargeUnitScaling.data_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1f8 + 0x50));
  std::ios_base::~ios_base(local_138);
  this_00 = this_01;
  if ((undefined1 *)local_1f8._48_8_ != local_1f8 + 0x40) {
    operator_delete((void *)local_1f8._48_8_,(ulong)((long)(_func_int ***)local_1f8._64_8_ + 1));
  }
LAB_0016cdea:
  bVar5 = AtomType::isDirectional(this_00);
  if (bVar5) {
    this_02 = (DirectionalAtom *)operator_new(0x130);
    DirectionalAtom::DirectionalAtom(this_02,this_00);
  }
  else {
    this_02 = (DirectionalAtom *)operator_new(0x88);
    Atom::Atom((Atom *)this_02,this_00);
  }
  iVar6 = IndexListContainer::pop(&localIndexMan->atomIndexContainer_);
  (this_02->super_Atom).super_StuntDouble.localIndex_ = iVar6;
  return &this_02->super_Atom;
}

Assistant:

Atom* MoleculeCreator::createAtom(ForceField* ff, AtomStamp* stamp,
                                    LocalIndexManager* localIndexMan) {
    AtomType* atomType;
    Atom* atom;

    atomType = ff->getAtomType(stamp->getType());
    if (atomType == NULL) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Can not find Matching Atom Type for[%s]",
               stamp->getType().c_str());

      painCave.isFatal = 1;
      simError();
    }

    if (stamp->hasOverride()) {
      std::string baseType = atomType->getName();
      RealType oc          = stamp->getOverrideCharge();

      // Create a new atom type name that builds in the override charge:
      std::ostringstream ss;
      ss << oc;
      std::string atomTypeOverrideName = baseType + "_q=" + ss.str();

      // Maybe we've seen this before?

      AtomType* atB = ff->getAtomType(atomTypeOverrideName);

      if (atB == NULL) {
        // Nope, we've never seen it before, so make a new one:
        AtomType* atomTypeOverride = new AtomType();
        // Base points to the atomType we already found
        atomTypeOverride->useBase(atomType);
        int ident = ff->getNAtomType();
        atomTypeOverride->setIdent(ident);
        atomTypeOverride->setName(atomTypeOverrideName);
        ff->addAtomType(atomTypeOverrideName, atomTypeOverride);
        FixedChargeAdapter fca = FixedChargeAdapter(atomTypeOverride);
        RealType charge =
            ff->getForceFieldOptions().getChargeUnitScaling() * oc;
        fca.makeFixedCharge(charge);
        // officially use override type for this atom
	atomType = atomTypeOverride;
      } else {
        // we've previously created the override type for this atom, so use that
        // one:
        atomType = atB;
      }
    }

    // below code still have some kind of hard-coding smell
    if (atomType->isDirectional()) {
      DirectionalAtom* dAtom;
      dAtom = new DirectionalAtom(atomType);
      atom  = dAtom;
    } else {
      atom = new Atom(atomType);
    }

    atom->setLocalIndex(localIndexMan->getNextAtomIndex());

    return atom;
  }